

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinematic_chain.c
# Opt level: O3

void rev_ffd(kcc_joint *joint,mc_abi *m,joint_torque *tau,mc_wrench *f,int count)

{
  double dVar1;
  double dVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  double *pdVar6;
  long lVar7;
  double dVar8;
  
  if (joint == (kcc_joint *)0x0) {
    __assert_fail("joint",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                  ,0x147,
                  "void rev_ffd(const struct kcc_joint *, const struct mc_abi *, const joint_torque *, struct mc_wrench *, int)"
                 );
  }
  if (m == (mc_abi *)0x0) {
    __assert_fail("m",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                  ,0x148,
                  "void rev_ffd(const struct kcc_joint *, const struct mc_abi *, const joint_torque *, struct mc_wrench *, int)"
                 );
  }
  if (tau == (joint_torque *)0x0) {
    __assert_fail("tau",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                  ,0x149,
                  "void rev_ffd(const struct kcc_joint *, const struct mc_abi *, const joint_torque *, struct mc_wrench *, int)"
                 );
  }
  if (f != (mc_wrench *)0x0) {
    if (0 < count) {
      lVar4 = (long)(int)(joint->field_1).revolute_joint.axis;
      dVar1 = *(double *)((long)&(m->second_moment_of_mass).field_0 + lVar4 * 0x20);
      dVar2 = *(joint->field_1).revolute_joint.inertia;
      lVar3 = 0;
      uVar5 = 0;
      do {
        dVar8 = tau[uVar5] / (dVar1 + dVar2);
        lVar7 = 0;
        pdVar6 = (double *)((long)&(m->second_moment_of_mass).field_0 + lVar4 * 8);
        do {
          *(double *)((long)&f->torque->field_0 + lVar7 + lVar3) = *pdVar6 * dVar8;
          *(double *)((long)&f->force->field_0 + lVar7 + lVar3) =
               *(double *)((long)&(m->first_moment_of_mass).field_0 + lVar7 + lVar4 * 0x18) * dVar8;
          lVar7 = lVar7 + 8;
          pdVar6 = pdVar6 + 3;
        } while (lVar7 != 0x18);
        uVar5 = uVar5 + 1;
        lVar3 = lVar3 + 0x18;
      } while (uVar5 != (uint)count);
    }
    return;
  }
  __assert_fail("f",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                ,0x14a,
                "void rev_ffd(const struct kcc_joint *, const struct mc_abi *, const joint_torque *, struct mc_wrench *, int)"
               );
}

Assistant:

static void rev_ffd(
        const struct kcc_joint *joint,
        const struct mc_abi *m,
        const joint_torque *tau,
        struct mc_wrench *f,
        int count)
{
    assert(joint);
    assert(m);
    assert(tau);
    assert(f);

    int k = joint->revolute_joint.axis;
    double d = m->second_moment_of_mass.row[k].data[k]
            + joint->revolute_joint.inertia[0];

    for (int i = 0; i < count; i++) {
        double qdd = tau[i] / d;
        for (int j = 0; j < 3; j++) {
            f->torque[i].data[j] = m->second_moment_of_mass.row[j].data[k] * qdd;
            f->force[i].data[j] = m->first_moment_of_mass.row[k].data[j] * qdd;    // consider transpose, thus [k, j]
        }
    }
}